

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::check_rx(Spi *this)

{
  ostream *poVar1;
  undefined4 local_1c;
  uchar local_15;
  DWORD dwNumBytesRead;
  BYTE byInputBuffer [1];
  Spi *pSStack_10;
  FT_STATUS ftStatus;
  Spi *this_local;
  
  local_1c = 0;
  pSStack_10 = this;
  while( true ) {
    dwNumBytesRead = FT_Read(this->ftHandle,&local_15,1,&local_1c);
    if (dwNumBytesRead != 0) break;
    poVar1 = std::operator<<((ostream *)&std::cerr,"Unexpected rx byte: ");
    poVar1 = std::operator<<(poVar1,local_15);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Spi::check_rx() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;

	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK)
			break;
		cerr << "Unexpected rx byte: " << byInputBuffer[0] << endl;
	}
}